

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenu::setNoReplayFor(QMenu *this,QWidget *noReplayFor)

{
  QWidget *in_RSI;
  QWidget *this_00;
  
  this_00 = in_RSI;
  d_func((QMenu *)0x64e585);
  QPointer<QWidget>::operator=((QPointer<QWidget> *)this_00,in_RSI);
  return;
}

Assistant:

void QMenu::setNoReplayFor(QWidget *noReplayFor)
{
    d_func()->noReplayFor = noReplayFor;
}